

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileAction.cpp
# Opt level: O1

void __thiscall QFileActionPrivate::triggered(QFileActionPrivate *this)

{
  Type TVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayDataPointer<char16_t> *this_00;
  QString dir;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  QArrayDataPointer<char16_t> local_20;
  
  local_20.d = (this->directory).d.d;
  local_20.ptr = (this->directory).d.ptr;
  local_20.size = (this->directory).d.size;
  if (local_20.d != (Data *)0x0) {
    LOCK();
    ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  if ((this->filePath).d.size != 0) {
    QString::operator=((QString *)&local_20,&this->filePath);
  }
  TVar1 = this->type;
  if (TVar1 == OpenFolder) {
    if ((this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>._M_payload.
        super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_engaged == true) {
      QFileDialog::getExistingDirectory
                (&local_38,0,&this->caption,&local_20,
                 (this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>.
                 _M_payload.super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_payload);
    }
    else {
      QFileDialog::getExistingDirectory(&local_38,0,&this->caption,&local_20,1);
    }
    qVar4 = local_98.size;
    pcVar3 = local_98.ptr;
    pDVar2 = local_98.d;
    this_00 = &local_38;
    local_98.d = local_38.d;
    local_98.ptr = local_38.ptr;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_98.size = local_38.size;
    local_38.size = qVar4;
  }
  else {
    if (TVar1 == SaveFile) {
      if ((this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>._M_payload.
          super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_engaged == true) {
        local_80.d = (Data *)0x0;
        local_80.ptr = L";;";
        local_80.size = 2;
        local_68.size = 0;
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        QtPrivate::QStringList_join((QList *)&local_50,(QChar *)&this->filter,0x18cd1c);
        QFileDialog::getSaveFileName
                  (&local_38,0,&this->caption,&local_20,&local_50,0,
                   (this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>.
                   _M_payload.super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_payload)
        ;
      }
      else {
        local_80.d = (Data *)0x0;
        local_80.ptr = L";;";
        local_80.size = 2;
        local_68.size = 0;
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        QtPrivate::QStringList_join((QList *)&local_50,(QChar *)&this->filter,0x18cd1c);
        QFileDialog::getSaveFileName(&local_38,0,&this->caption,&local_20,&local_50,0,0);
      }
    }
    else {
      if (TVar1 != OpenFile) goto LAB_001804f3;
      if ((this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>._M_payload.
          super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_engaged == true) {
        local_80.d = (Data *)0x0;
        local_80.ptr = L";;";
        local_80.size = 2;
        local_68.size = 0;
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        QtPrivate::QStringList_join((QList *)&local_50,(QChar *)&this->filter,0x18cd1c);
        QFileDialog::getOpenFileName
                  (&local_38,0,&this->caption,&local_20,&local_50,0,
                   (this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>.
                   _M_payload.super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_payload)
        ;
      }
      else {
        local_80.d = (Data *)0x0;
        local_80.ptr = L";;";
        local_80.size = 2;
        local_68.size = 0;
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        QtPrivate::QStringList_join((QList *)&local_50,(QChar *)&this->filter,0x18cd1c);
        QFileDialog::getOpenFileName(&local_38,0,&this->caption,&local_20,&local_50,0,0);
      }
    }
    qVar4 = local_98.size;
    pcVar3 = local_98.ptr;
    pDVar2 = local_98.d;
    local_98.d = local_38.d;
    local_98.ptr = local_38.ptr;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_98.size = local_38.size;
    local_38.size = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    this_00 = &local_68;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
LAB_001804f3:
  if (local_98.ptr != (char16_t *)0x0) {
    QFileAction::setFilePath(this->action,(QString *)&local_98);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
  return;
}

Assistant:

void triggered() {
        QString dir = directory;
        QString fn;

        if (!filePath.isEmpty()) {
            dir = filePath;
        }

        switch (type) {
        case QFileAction::Type::OpenFile:
            if (options) {
                fn = QFileDialog::getOpenFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")), nullptr,
                                                  *options);
            } else {
                fn = QFileDialog::getOpenFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")));
            }

            break;
        case QFileAction::Type::SaveFile:
            if (options) {
                fn = QFileDialog::getSaveFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")), nullptr,
                                                  *options);
            } else {
                fn = QFileDialog::getSaveFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")));
            }

            break;
        case QFileAction::Type::OpenFolder:
            if (options) {
                fn = QFileDialog::getExistingDirectory(nullptr, caption, dir, *options);
            } else {
                fn = QFileDialog::getExistingDirectory(nullptr, caption, dir);
            }

            break;
        }

        if (!fn.isNull()) {
            action->setFilePath(fn);
        }
    }